

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int checkForTemps(LayerStack *g,uint64_t seed,int x,int z,int w,int h,int *tc)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t __nmemb;
  int *out;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  Layer *layer;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int ccnt [9];
  int local_58 [10];
  
  iVar11 = tc[7];
  iVar2 = tc[6];
  if (tc[6] < 1) {
    iVar2 = 0;
  }
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  iVar3 = tc[8];
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar3 = iVar3 + iVar11 + iVar2;
  if (iVar3 != 0) {
    if (h < 1) {
      return 0;
    }
    lVar6 = (seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * seed + 0x6957b26727512035;
    lVar6 = (lVar6 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar6 + 0x6957b26727512035;
    lVar6 = (lVar6 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar6 + 0x6957b26727512035;
    lVar6 = (lVar6 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar6;
    uVar4 = 0;
    do {
      if (0 < w) {
        lVar8 = (long)x;
        uVar9 = (ulong)(uint)w;
        lVar10 = (long)x * 0x5851f42d4c957f2d + 0x14057b7ef767814f + lVar6 * 0x5851f42d4c957f2d;
        do {
          lVar7 = (lVar6 + lVar8) * lVar10 + uVar4 + (long)z;
          lVar7 = (lVar7 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar7 + lVar8;
          iVar3 = iVar3 - (uint)(((long)((lVar7 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar7 +
                                        uVar4 + (long)z) >> 0x18) * 0x4ec4ec4ec4ec4ec5 +
                                 0x9d89d89d89d89d8U < 0x13b13b13b13b13b1);
          lVar8 = lVar8 + 1;
          lVar10 = lVar10 + 0x5851f42d4c957f2d;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)h);
    if (0 < iVar3) {
      return 0;
    }
  }
  layer = g->layers + 0xe;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[8] = 0;
  __nmemb = getMinLayerCacheSize(layer,w,h);
  out = (int *)calloc(__nmemb,4);
  setLayerSeed(layer,seed);
  genArea(layer,out,x,z,w,h);
  if (0 < h * w) {
    uVar4 = 0;
    do {
      uVar5 = out[uVar4] & 0xff;
      uVar1 = uVar5 + 5;
      if (uVar5 == 4) {
        uVar1 = uVar5;
      }
      if ((uint)out[uVar4] < 0x100) {
        uVar1 = uVar5;
      }
      local_58[uVar1] = local_58[uVar1] + 1;
      uVar4 = uVar4 + 1;
    } while ((uint)(h * w) != uVar4);
  }
  iVar11 = 0;
  lVar6 = 0;
  do {
    if ((local_58[lVar6] < tc[lVar6]) || (tc[lVar6] < 0 && local_58[lVar6] != 0)) goto LAB_00114bf1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 9);
  iVar11 = 1;
LAB_00114bf1:
  free(out);
  return iVar11;
}

Assistant:

int checkForTemps(LayerStack *g, uint64_t seed, int x, int z, int w, int h, const int tc[9])
{
    uint64_t ls = getLayerSalt(3); // L_SPECIAL_1024 layer seed
    uint64_t ss = getStartSeed(seed, ls);

    int i, j;
    int scnt = 0;

    if (tc[Special+Warm] > 0) scnt += tc[Special+Warm];
    if (tc[Special+Lush] > 0) scnt += tc[Special+Lush];
    if (tc[Special+Cold] > 0) scnt += tc[Special+Cold];

    if (scnt > 0)
    {
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                if (mcFirstIsZero(getChunkSeed(ss, x+i, z+j), 13))
                    scnt--;
            }
        }
        if (scnt > 0)
            return 0;
    }

    Layer *l = &g->layers[L_SPECIAL_1024];
    int ccnt[9] = {0};
    int *area = (int*) calloc(getMinLayerCacheSize(l, w, h), sizeof(int));
    int ret = 1;

    setLayerSeed(l, seed);
    genArea(l, area, x, z, w, h);

    for (i = 0; i < w*h; i++)
    {
        int id = area[i];
        int t = id & 0xff;
        if (id != t && t != Freezing)
            t += Special;
        ccnt[t]++;
    }
    for (i = 0; i < 9; i++)
    {
        if (ccnt[i] < tc[i] || (ccnt[i] && tc[i] < 0))
        {
            ret = 0;
            break;
        }
    }

    free(area);
    return ret;
}